

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fPrerequisiteTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::ClearColorCase::iterate(ClearColorCase *this)

{
  deUint32 dVar1;
  GLenum err;
  int iVar2;
  undefined1 local_30 [8];
  deRandom rnd;
  int a;
  int b;
  int g;
  int r;
  ClearColorCase *this_local;
  
  b = 0;
  a = 0;
  rnd.w = 0;
  rnd.z = 0xff;
  switch(this->m_curIter) {
  case 0:
    break;
  case 1:
    b = 0xff;
    a = 0xff;
    rnd.w = 0xff;
    break;
  case 2:
    b = 0xff;
    break;
  case 3:
    a = 0xff;
    break;
  case 4:
    rnd.w = 0xff;
    break;
  default:
    dVar1 = ::deInt32Hash(this->m_curIter);
    deRandom_init((deRandom *)local_30,dVar1);
    dVar1 = deRandom_getUint32((deRandom *)local_30);
    b = dVar1 & 0xff;
    dVar1 = deRandom_getUint32((deRandom *)local_30);
    a = dVar1 & 0xff;
    dVar1 = deRandom_getUint32((deRandom *)local_30);
    rnd.w = dVar1 & 0xff;
    dVar1 = deRandom_getUint32((deRandom *)local_30);
    rnd.z = dVar1 & 0xff;
  }
  glwClearColor((float)b / 255.0,(float)a / 255.0,(float)(int)rnd.w / 255.0,(float)rnd.z / 255.0);
  glwClear(0x4000);
  err = glwGetError();
  glu::checkError(err,"CLES2 ClearColor failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fPrerequisiteTests.cpp"
                  ,0x90);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar2 = this->m_curIter + 1;
  this->m_curIter = iVar2;
  return (uint)(iVar2 < this->m_numIters);
}

Assistant:

TestCase::IterateResult ClearColorCase::iterate (void)
{
	int r = 0;
	int g = 0;
	int b = 0;
	int a = 255;

	switch (m_curIter)
	{
		case 0:
			// Black, skip
			break;
		case 1:
			r = 255;
			g = 255;
			b = 255;
			break;
		case 2:
			r = 255;
			break;
		case 3:
			g = 255;
			break;
		case 4:
			b = 255;
			break;
		default:
			deRandom rnd;
			deRandom_init(&rnd, deInt32Hash(m_curIter));
			r = (int)(deRandom_getUint32(&rnd) & 0xFF);
			g = (int)(deRandom_getUint32(&rnd) & 0xFF);
			b = (int)(deRandom_getUint32(&rnd) & 0xFF);
			a = (int)(deRandom_getUint32(&rnd) & 0xFF);
			break;

	};

	glClearColor(float(r)/255.0f, float(g)/255.0f, float(b)/255.0f, float(a)/255.0f);
	glClear(GL_COLOR_BUFFER_BIT);

	GLU_CHECK_MSG("CLES2 ClearColor failed.");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return (++m_curIter < m_numIters) ? CONTINUE : STOP;
}